

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_m2mf.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::M2mf::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,M2mf *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar2;
  SingleMthdTest *this_01;
  result_type rVar3;
  Test *pTVar4;
  MthdDmaGrobj *pMVar5;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_2b9;
  Test *local_2b8;
  Test *local_2b0;
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  Test *local_288;
  Test *local_280;
  Test *local_278;
  MthdDmaGrobj *local_270;
  MthdDmaGrobj *local_268;
  Test *local_260;
  Test *local_258;
  SingleMthdTest *local_250;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_248;
  undefined1 *local_240;
  long local_238;
  undefined1 local_230 [16];
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  undefined1 *local_160;
  long local_158;
  undefined1 local_150 [16];
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  undefined1 *local_120;
  long local_118;
  undefined1 local_110 [16];
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  string local_e0;
  string local_c0;
  SingleMthdTest *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  MthdDmaGrobj *local_80;
  MthdDmaGrobj *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_250 = this_01;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar3);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this_01->name,local_100,local_100 + local_f8)
  ;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_a0 = this_01;
  pTVar4 = (Test *)operator_new(0x25950);
  local_258 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_120,local_120 + local_118);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_98 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_260 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_140 = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"pm_trigger","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_140,local_140 + local_138);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_90 = pTVar4;
  local_2b0 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_160 = local_150;
  local_248 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"dma_notify","");
  pTVar4 = local_2b0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2b0,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 1;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_160,local_160 + local_158);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_88 = pTVar4;
  pMVar5 = (MthdDmaGrobj *)operator_new(0x25960);
  local_268 = pMVar5;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dma_in","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar5,opt,(uint32_t)rVar3,&local_c0,2,(this->super_Class).cls,0x184,0,2);
  local_80 = pMVar5;
  pMVar5 = (MthdDmaGrobj *)operator_new(0x25960);
  local_270 = pMVar5;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"dma_out","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar5,opt,(uint32_t)rVar3,&local_e0,3,(this->super_Class).cls,0x188,1,9);
  local_78 = pMVar5;
  local_2b8 = (Test *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"offset_in","");
  pTVar4 = local_2b8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2b8,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 4;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_180,local_180 + local_178);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035bfc0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_70 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_278 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"offset_out","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 5;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1a0,local_1a0 + local_198);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035bfc0;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_68 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_280 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"pitch_in","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x314;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 6;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1c0,local_1c0 + local_1b8);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035c0b8;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 0;
  local_60 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25958);
  local_288 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"pitch_out","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 7;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1e0,local_1e0 + local_1d8);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035c0b8;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x119) = 1;
  local_58 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"line_length","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x31c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 8;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_200,local_200 + local_1f8);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035c1b0;
  local_50 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"line_count","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 800;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 9;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_220,local_220 + local_218);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035c2a8;
  local_48 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"format","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x324;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 10;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_240,local_240 + local_238);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035c3a0;
  local_40 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"trigger","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x328;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2a8,local_2a8 + local_2a0);
  pvVar2 = local_248;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035c498;
  __l._M_len = 0xe;
  __l._M_array = &local_a0;
  local_38 = pTVar4;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_248,__l,&local_2b9);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  return pvVar2;
}

Assistant:

std::vector<SingleMthdTest *> M2mf::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_in", 2, cls, 0x184, 0, DMA_R | DMA_CLR),
		new MthdDmaGrobj(opt, rnd(), "dma_out", 3, cls, 0x188, 1, DMA_W | DMA_CHECK_PREV),
		new MthdM2mfOffset(opt, rnd(), "offset_in", 4, cls, 0x30c, 0),
		new MthdM2mfOffset(opt, rnd(), "offset_out", 5, cls, 0x310, 1),
		new MthdM2mfPitch(opt, rnd(), "pitch_in", 6, cls, 0x314, 0),
		new MthdM2mfPitch(opt, rnd(), "pitch_out", 7, cls, 0x318, 1),
		new MthdM2mfLineLength(opt, rnd(), "line_length", 8, cls, 0x31c),
		new MthdM2mfLineCount(opt, rnd(), "line_count", 9, cls, 0x320),
		new MthdM2mfFormat(opt, rnd(), "format", 10, cls, 0x324),
		new MthdM2mfTrigger(opt, rnd(), "trigger", 11, cls, 0x328),
	};
}